

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void fly_apart_anim_done_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Object interp;
  Am_Object AStack_18;
  Am_Object local_10;
  
  pAVar2 = Am_Object::Get(cmd,0x171,0);
  Am_Object::Am_Object(&AStack_18,pAVar2);
  pAVar2 = Am_Object::Get(&AStack_18,0x10e,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set(&AStack_18,0x10e,iVar1 + -1,0);
  if (iVar1 + -1 == 0) {
    Am_Object::Am_Object(&local_10,&AStack_18);
    Am_Stop_Animator(&local_10);
    Am_Object::~Am_Object(&local_10);
  }
  Am_Object::~Am_Object(&AStack_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, fly_apart_anim_done, (Am_Object cmd))
{
  Am_Object interp = cmd.Get(Am_SAVED_OLD_OBJECT_OWNER);
  int i = (int)interp.Get(Am_WIGGLES) - 1;
  interp.Set(Am_WIGGLES, i);
  //std::cout << " Anim done, cnt = " << i <<std::endl <<std::flush;
  if (i == 0)
    Am_Stop_Animator(interp);
}